

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O0

tc_toktyp_t __thiscall CTcTokenizer::next_on_line_xlat_keep(CTcTokenizer *this)

{
  wchar_t wVar1;
  int iVar2;
  tc_toktyp_t tVar3;
  CVmHashEntry *this_00;
  char *pcVar4;
  CTcToken *pCVar5;
  size_t sVar6;
  long in_RDI;
  int in_stack_00000044;
  tok_embed_ctx *in_stack_00000048;
  CTcToken *in_stack_00000050;
  utf8_ptr *in_stack_00000058;
  char *p_1;
  CTcHashEntryKw *kw;
  char *p;
  tc_toktyp_t typ;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  CTcTokenizer *in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  CTcTokenizer *in_stack_ffffffffffffff80;
  tok_embed_ctx *in_stack_ffffffffffffff88;
  CTcTokenizer *in_stack_ffffffffffffff90;
  tc_toktyp_t local_14;
  
  do {
    skip_ws_and_markers((utf8_ptr *)in_stack_ffffffffffffff70);
    wVar1 = utf8_ptr::getch((utf8_ptr *)0x28fb4c);
    if ((wVar1 == L'\"') || (wVar1 == L'\'')) {
      tVar3 = xlat_string_to_src(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                                 (int)((ulong)in_stack_ffffffffffffff80 >> 0x20));
      return tVar3;
    }
    if (wVar1 == L'>') {
      iVar2 = tok_embed_ctx::in_expr((tok_embed_ctx *)(in_RDI + 0x288));
      if (((iVar2 != 0) &&
          (iVar2 = tok_embed_ctx::parens((tok_embed_ctx *)in_stack_ffffffffffffff70), iVar2 == 0))
         && (wVar1 = utf8_ptr::getch_at((utf8_ptr *)in_stack_ffffffffffffff70,
                                        CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68
                                                )), wVar1 == L'>')) {
        tVar3 = xlat_string_to_src(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                                   (int)((ulong)in_stack_ffffffffffffff80 >> 0x20));
        return tVar3;
      }
    }
    else if ((wVar1 == L'R') &&
            ((wVar1 = utf8_ptr::getch_at((utf8_ptr *)in_stack_ffffffffffffff70,
                                         CONCAT44(in_stack_ffffffffffffff6c,
                                                  in_stack_ffffffffffffff68)), wVar1 == L'\"' ||
             (wVar1 = utf8_ptr::getch_at((utf8_ptr *)in_stack_ffffffffffffff70,
                                         CONCAT44(in_stack_ffffffffffffff6c,
                                                  in_stack_ffffffffffffff68)), wVar1 == L'\'')))) {
      tVar3 = xlat_string_to_src(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                                 (int)((ulong)in_stack_ffffffffffffff80 >> 0x20));
      return tVar3;
    }
    local_14 = next_on_line(in_stack_00000058,in_stack_00000050,in_stack_00000048,in_stack_00000044)
    ;
    if (local_14 != TOKT_INVALID) {
      if (local_14 == TOKT_SYM) {
        CTcToken::get_text((CTcToken *)(in_RDI + 0xcc8));
        CTcToken::get_text_len((CTcToken *)(in_RDI + 0xcc8));
        this_00 = CVmHashTable::find((CVmHashTable *)in_stack_ffffffffffffff88,
                                     (char *)in_stack_ffffffffffffff80,
                                     (size_t)in_stack_ffffffffffffff78);
        if (this_00 == (CVmHashEntry *)0x0) {
          CTcToken::get_text((CTcToken *)(in_RDI + 0xcc8));
          CTcToken::get_text_len((CTcToken *)(in_RDI + 0xcc8));
          pcVar4 = store_source(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                                (size_t)in_stack_ffffffffffffff70);
          pCVar5 = (CTcToken *)(in_RDI + 0xcc8);
          sVar6 = CTcToken::get_text_len((CTcToken *)(in_RDI + 0xcc8));
          CTcToken::set_text(pCVar5,pcVar4,sVar6);
        }
        else {
          local_14 = CTcHashEntryKw::get_tok_id((CTcHashEntryKw *)this_00);
          CTcToken::settyp((CTcToken *)(in_RDI + 0xcc8),local_14);
        }
      }
      else if (local_14 - TOKT_FLOAT < 2) {
        pcVar4 = CTcToken::get_text((CTcToken *)(in_RDI + 0xcc8));
        CTcToken::get_text_len((CTcToken *)(in_RDI + 0xcc8));
        pcVar4 = store_source(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,(size_t)pcVar4);
        pCVar5 = (CTcToken *)(in_RDI + 0xcc8);
        sVar6 = CTcToken::get_text_len((CTcToken *)(in_RDI + 0xcc8));
        CTcToken::set_text(pCVar5,pcVar4,sVar6);
      }
      return local_14;
    }
    pcVar4 = CTcToken::get_text((CTcToken *)(in_RDI + 0xcc8));
    wVar1 = utf8_ptr::s_getch(pcVar4);
    if (wVar1 == L'�') {
      log_error_curtok(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
    }
    else {
      log_error_curtok(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
    }
    utf8_ptr::inc((utf8_ptr *)in_stack_ffffffffffffff70);
  } while( true );
}

Assistant:

tc_toktyp_t CTcTokenizer::next_on_line_xlat_keep()
{
    tc_toktyp_t typ;

    /* keep going until we find a valid symbol */
    for (;;)
    {
        /* skip whitespace and macro expansion flags */
        skip_ws_and_markers(&p_);
        
        /* see what we have */
        switch(p_.getch())
        {
        case '"':
        case '\'':
            /* it's a string - translate and save it */
            return xlat_string_to_src(&main_in_embedding_, FALSE);

        case '>':
            /* if we're in an embedding, this is the end of it */
            if (main_in_embedding_.in_expr()
                && main_in_embedding_.parens() == 0
                && p_.getch_at(1) == '>')
                return xlat_string_to_src(&main_in_embedding_, FALSE);

            /* use the normal parsing */
            goto do_normal;

        case 'R':
            /* check for a regex string */
            if (p_.getch_at(1) == '"' || p_.getch_at(1) == '\'')
                return xlat_string_to_src(&main_in_embedding_, FALSE);

            /* not a regex string - fall through to the default case */
            
        default:
        do_normal:
            /* for anything else, use the default tokenizer */
            typ = next_on_line(&p_, &curtok_, &main_in_embedding_, FALSE);
            
            /* check the token type */
            switch(typ)
            {
            case TOKT_SYM:
                /* symbol */
                {
                    const char *p;
                    CTcHashEntryKw *kw;
                
                    /* look it up in the keyword table */
                    kw = (CTcHashEntryKw *)kw_->find(curtok_.get_text(),
                        curtok_.get_text_len());
                    if (kw != 0)
                    {
                        /* replace the token with the keyword token type */
                        typ = kw->get_tok_id();
                        curtok_.settyp(typ);
                    }
                    else
                    {
                        /* ordinary symbol - save the text */
                        p = store_source(curtok_.get_text(),
                                         curtok_.get_text_len());
                        
                        /* 
                         *   change the token's text to point to the
                         *   source block, so that this token's text
                         *   pointer will remain permanently valid (the
                         *   original copy, in the source line buffer,
                         *   will be overwritten as soon as we read
                         *   another source line; we don't want the caller
                         *   to have to worry about this, so we return the
                         *   permanent copy) 
                         */
                        curtok_.set_text(p, curtok_.get_text_len());
                    }
                }
                break;

            case TOKT_FLOAT:
            case TOKT_BIGINT:
                /* floating-point number (or promoted large integer) */
                {
                    const char *p;

                    /* 
                     *   save the text so that it remains permanently
                     *   valid - we keep track of floats by the original
                     *   text, and let the code generator produce the
                     *   appropriate object file representation 
                     */
                    p = store_source(curtok_.get_text(),
                                     curtok_.get_text_len());
                    curtok_.set_text(p, curtok_.get_text_len());
                }
                break;

            case TOKT_INVALID:
                /* 
                 *   check for unmappable characters - these will show up as
                 *   Unicode U+FFFD, the "replacement character"; log it as
                 *   'unmappable' if applicable, otherwise as an invalid
                 *   character 
                 */
                if (utf8_ptr::s_getch(curtok_.get_text()) == 0xfffd)
                    log_error_curtok(TCERR_UNMAPPABLE_CHAR);
                else
                    log_error_curtok(TCERR_INVALID_CHAR);

                /* skip this character */
                p_.inc();
                
                /* keep going */
                continue;

            default:
                break;
            }
        }

        /* return the type */
        return typ;
    }
}